

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O3

void __thiscall helics::apps::BrokerServer::startServers(BrokerServer *this)

{
  pointer psVar1;
  element_type *peVar2;
  pointer __p;
  size_type sVar3;
  pointer pcVar4;
  size_type sVar5;
  WebServer *pWVar6;
  shared_ptr<helics::apps::TypedBrokerServer> *server;
  pointer psVar7;
  shared_ptr<helics::apps::zmqBrokerServer> zmqs;
  data local_38;
  shared_ptr<helics::apps::TypedBrokerServer> local_28;
  
  if ((this->configFile_)._M_string_length == 0) {
    local_38._0_8_ = local_38._0_8_ & 0xffffffffffffff00;
    local_38.m_value.object = (object_t *)0x0;
    __p = (pointer)operator_new(0x10);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)__p,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)&local_38);
  }
  else {
    fileops::loadJson((fileops *)&local_38,(string *)&this->configFile_);
    __p = (pointer)operator_new(0x10);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)__p,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)&local_38);
  }
  local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  CLI::std::
  __uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
  ::reset((__uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
           *)&this->config_,__p);
  CLI::std::
  unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>::
  ~unique_ptr((unique_ptr<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
               *)&local_28);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_38);
  if ((this->zmq_server != false) || (this->zmq_ss_server == true)) {
    local_38._0_8_ = (WebServer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::apps::zmqBrokerServer,std::allocator<helics::apps::zmqBrokerServer>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.m_value,
               (zmqBrokerServer **)&local_38,(allocator<helics::apps::zmqBrokerServer> *)&local_28,
               &this->server_name_);
    if (this->zmq_server == true) {
      *(bool *)&((mutex *)&((string *)(local_38._0_8_ + 0x58))->_M_string_length)->
                super___mutex_base = true;
    }
    if (this->zmq_ss_server == true) {
      *(bool *)((long)(((mutex *)&((string *)(local_38._0_8_ + 0x58))->_M_string_length)->
                      super___mutex_base)._M_mutex.__size + 1) = true;
    }
    sVar5 = (this->mZmqArgs)._M_string_length;
    pWVar6 = (WebServer *)local_38._0_8_;
    if (sVar5 != 0) {
      (*((TypedBrokerServer *)local_38._0_8_)->_vptr_TypedBrokerServer[4])
                (local_38._0_8_,sVar5,(this->mZmqArgs)._M_dataplus._M_p);
      pWVar6 = (WebServer *)local_38._0_8_;
    }
    local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value;
    local_38._0_8_ = (WebServer *)0x0;
    local_38.m_value.object = (object_t *)0x0;
    local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = &pWVar6->super_TypedBrokerServer;
    std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
    ::emplace_back<std::shared_ptr<helics::apps::TypedBrokerServer>>
              ((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
                *)&this->servers,&local_28);
    if (local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.
                 super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value.object !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value.object);
    }
  }
  if ((this->tcp_server != false) || (this->udp_server == true)) {
    local_38._0_8_ = (WebServer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::apps::AsioBrokerServer,std::allocator<helics::apps::AsioBrokerServer>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.m_value,
               (AsioBrokerServer **)&local_38,(allocator<helics::apps::AsioBrokerServer> *)&local_28
               ,&this->server_name_);
    if (this->tcp_server == true) {
      *(bool *)((long)(((string *)(local_38._0_8_ + 0x98))->field_2)._M_local_buf + 8) = true;
      sVar5 = (this->mTcpArgs)._M_string_length;
      if (sVar5 != 0) {
        (*((TypedBrokerServer *)local_38._0_8_)->_vptr_TypedBrokerServer[4])
                  (local_38._0_8_,sVar5,(this->mTcpArgs)._M_dataplus._M_p);
      }
    }
    pWVar6 = (WebServer *)local_38._0_8_;
    if (this->udp_server == true) {
      *(bool *)((long)(((string *)(local_38._0_8_ + 0x98))->field_2)._M_local_buf + 9) = true;
      sVar5 = (this->mUdpArgs)._M_string_length;
      if (sVar5 != 0) {
        (*((TypedBrokerServer *)local_38._0_8_)->_vptr_TypedBrokerServer[4])
                  (local_38._0_8_,sVar5,(this->mUdpArgs)._M_dataplus._M_p);
        pWVar6 = (WebServer *)local_38._0_8_;
      }
    }
    local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value;
    local_38._0_8_ = (WebServer *)0x0;
    local_38.m_value.object = (object_t *)0x0;
    local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = &pWVar6->super_TypedBrokerServer;
    std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
    ::emplace_back<std::shared_ptr<helics::apps::TypedBrokerServer>>
              ((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
                *)&this->servers,&local_28);
    if (local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.
                 super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value.object !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value.object);
    }
  }
  if ((this->http_server != false) || (this->websocket_server == true)) {
    local_38._0_8_ = (WebServer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::apps::WebServer,std::allocator<helics::apps::WebServer>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.m_value,
               (WebServer **)&local_38,(allocator<helics::apps::WebServer> *)&local_28,
               &this->server_name_);
    if (this->http_server == true) {
      *(undefined1 *)(local_38._0_8_ + 0xe4) = 1;
      sVar5 = (this->mHttpArgs)._M_string_length;
      if (sVar5 != 0) {
        pcVar4 = (this->mHttpArgs)._M_dataplus._M_p;
        sVar3 = 0;
        do {
          if (pcVar4[sVar3] != ' ') {
            if (pcVar4[sVar3] == '-' && sVar3 != 0xffffffffffffffff) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&this->mHttpArgs,0,0,"http ",5);
              pcVar4 = (this->mHttpArgs)._M_dataplus._M_p;
              sVar5 = (this->mHttpArgs)._M_string_length;
            }
            break;
          }
          sVar3 = sVar3 + 1;
        } while (sVar5 != sVar3);
        (*((TypedBrokerServer *)local_38._0_8_)->_vptr_TypedBrokerServer[4])
                  (local_38._0_8_,sVar5,pcVar4);
      }
    }
    pWVar6 = (WebServer *)local_38._0_8_;
    if (this->websocket_server == true) {
      *(undefined1 *)(local_38._0_8_ + 0xe5) = 1;
      sVar5 = (this->mWebSocketArgs)._M_string_length;
      if (sVar5 != 0) {
        pcVar4 = (this->mWebSocketArgs)._M_dataplus._M_p;
        sVar3 = 0;
        do {
          if (pcVar4[sVar3] != ' ') {
            if (pcVar4[sVar3] == '-' && sVar3 != 0xffffffffffffffff) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&this->mWebSocketArgs,0,0,"websocket ",10);
              pcVar4 = (this->mWebSocketArgs)._M_dataplus._M_p;
              sVar5 = (this->mWebSocketArgs)._M_string_length;
            }
            break;
          }
          sVar3 = sVar3 + 1;
        } while (sVar5 != sVar3);
        (*((TypedBrokerServer *)local_38._0_8_)->_vptr_TypedBrokerServer[4])
                  (local_38._0_8_,sVar5,pcVar4);
        pWVar6 = (WebServer *)local_38._0_8_;
      }
    }
    local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value;
    local_38._0_8_ = (WebServer *)0x0;
    local_38.m_value.object = (object_t *)0x0;
    local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = &pWVar6->super_TypedBrokerServer;
    std::
    vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
    ::emplace_back<std::shared_ptr<helics::apps::TypedBrokerServer>>
              ((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>>>
                *)&this->servers,&local_28);
    if (local_28.super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.
                 super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value.object !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.m_value.object);
    }
  }
  psVar1 = (this->servers).
           super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->servers).
                super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar1; psVar7 = psVar7 + 1) {
    peVar2 = (psVar7->
             super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    (*peVar2->_vptr_TypedBrokerServer[2])
              (peVar2,(this->config_)._M_t.
                      super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
                      .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl,
               psVar7);
  }
  return;
}

Assistant:

void BrokerServer::startServers()
{
    if (!configFile_.empty()) {
        config_ = std::make_unique<fileops::JsonStorage>(fileops::loadJson(configFile_));
    } else {
        config_ = std::make_unique<fileops::JsonStorage>(nlohmann::json());
    }
    if (zmq_server || zmq_ss_server) {
        auto zmqs = std::make_shared<zmqBrokerServer>(server_name_);
        if (zmq_server) {
            zmqs->enableZmqServer(true);
        }
        if (zmq_ss_server) {
            zmqs->enableZmqSsServer(true);
        }
        if (!mZmqArgs.empty()) {
            zmqs->processArgs(mZmqArgs);
        }
        servers.push_back(std::move(zmqs));
    }
    if (tcp_server || udp_server) {
        auto asios = std::make_shared<AsioBrokerServer>(server_name_);
        if (tcp_server) {
            asios->enableTcpServer(true);
            if (!mTcpArgs.empty()) {
                asios->processArgs(mTcpArgs);
            }
        }
        if (udp_server) {
            asios->enableUdpServer(true);
            if (!mUdpArgs.empty()) {
                asios->processArgs(mUdpArgs);
            }
        }
        servers.push_back(std::move(asios));
    }

    if (http_server || websocket_server) {
#ifdef HELICS_ENABLE_WEBSERVER
        auto webs = std::make_shared<WebServer>(server_name_);
        if (http_server) {
            webs->enableHttpServer(true);
            if (!mHttpArgs.empty()) {
                auto fc = mHttpArgs.find_first_not_of(' ');
                if (fc != std::string::npos) {
                    if (mHttpArgs[fc] == '-') {
                        mHttpArgs.insert(0, "http ", 5);
                    }
                }

                webs->processArgs(mHttpArgs);
            }
        }
        if (websocket_server) {
            webs->enableWebSocketServer(true);
            if (!mWebSocketArgs.empty()) {
                auto fc = mWebSocketArgs.find_first_not_of(' ');
                if (fc != std::string::npos) {
                    if (mWebSocketArgs[fc] == '-') {
                        mWebSocketArgs.insert(0, "websocket ", 10);
                    }
                }
                webs->processArgs(mWebSocketArgs);
            }
        }
        servers.push_back(std::move(webs));
#else
        std::cout << "Webserver not enabled" << std::endl;
#endif
    }
    for (auto& server : servers) {
        server->startServer(&config_->json(), server);
    }
}